

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recog_intel.c
# Opt level: O2

int cpuid_identify_intel(cpu_raw_data_t *raw,cpu_id_t *data,internal_id_info_t *internal)

{
  char cVar1;
  undefined1 uVar2;
  ushort uVar3;
  cpu_purpose_t cVar4;
  int iVar5;
  int iVar6;
  size_t sVar7;
  ulong uVar8;
  ulong uVar9;
  char *pcVar10;
  ushort **ppuVar11;
  byte bVar12;
  uint uVar13;
  long lVar14;
  long lVar15;
  amd_code_t aVar16;
  amd_code_t brand_code;
  uint uVar17;
  feature_map_t *pfVar18;
  feature_map_t *pfVar19;
  ulong uVar20;
  char *pcVar21;
  bool bVar22;
  cpu_epc_t cVar23;
  uint local_1ac;
  feature_map_t matchtable_edx81 [1];
  feature_map_t matchtable_ecx1 [10];
  uint8_t local_138;
  uint8_t local_132;
  uint8_t local_131;
  uint8_t local_130;
  uint8_t local_128;
  uint8_t local_127;
  uint8_t local_126;
  uint8_t local_125;
  uint8_t local_120;
  uint8_t local_11f;
  uint8_t local_11e;
  uint8_t local_11d;
  uint8_t local_11c;
  uint8_t local_11b;
  uint8_t local_119;
  uint8_t local_116;
  uint8_t local_115;
  uint8_t local_114;
  uint8_t local_113;
  uint8_t local_112;
  uint8_t local_111;
  feature_map_t matchtable_ebx7 [5];
  feature_map_t matchtable_edx1 [7];
  
  matchtable_edx1[4].bit = 0x1d;
  matchtable_edx1[4].feature = CPU_FEATURE_TM;
  matchtable_edx1[5].bit = 0x1e;
  matchtable_edx1[5].feature = CPU_FEATURE_IA64;
  matchtable_edx1[2].bit = 0x16;
  matchtable_edx1[2].feature = CPU_FEATURE_ACPI;
  matchtable_edx1[3].bit = 0x1b;
  matchtable_edx1[3].feature = CPU_FEATURE_SS;
  matchtable_edx1[0].bit = 0x12;
  matchtable_edx1[0].feature = CPU_FEATURE_PN;
  matchtable_edx1[1].bit = 0x15;
  matchtable_edx1[1].feature = CPU_FEATURE_DTS;
  matchtable_edx1[6].bit = 0x1f;
  matchtable_edx1[6].feature = CPU_FEATURE_PBE;
  pfVar18 = (feature_map_t *)&DAT_0012d290;
  pfVar19 = matchtable_ecx1;
  for (lVar14 = 10; lVar14 != 0; lVar14 = lVar14 + -1) {
    *pfVar19 = *pfVar18;
    pfVar18 = pfVar18 + 1;
    pfVar19 = pfVar19 + 1;
  }
  matchtable_edx81[0].bit = 0x14;
  matchtable_edx81[0].feature = CPU_FEATURE_XD;
  matchtable_ebx7[2].bit = 0xb;
  matchtable_ebx7[2].feature = CPU_FEATURE_RTM;
  matchtable_ebx7[3].bit = 0x1a;
  matchtable_ebx7[3].feature = CPU_FEATURE_AVX512PF;
  matchtable_ebx7[0].bit = 2;
  matchtable_ebx7[0].feature = CPU_FEATURE_SGX;
  matchtable_ebx7[1].bit = 4;
  matchtable_ebx7[1].feature = CPU_FEATURE_HLE;
  matchtable_ebx7[4].bit = 0x1b;
  matchtable_ebx7[4].feature = CPU_FEATURE_AVX512ER;
  if (raw->basic_cpuid[0][0] != 0) {
    match_features(matchtable_edx1,7,raw->basic_cpuid[1][3],data);
    match_features(matchtable_ecx1,10,raw->basic_cpuid[1][2],data);
  }
  if (raw->ext_cpuid[0][0] != 0) {
    match_features(matchtable_edx81,1,raw->ext_cpuid[1][3],data);
  }
  uVar13 = raw->basic_cpuid[0][0];
  if (6 < uVar13) {
    match_features(matchtable_ebx7,5,raw->basic_cpuid[7][1],data);
    uVar13 = raw->basic_cpuid[0][0];
  }
  if (uVar13 < 4) {
    if (1 < uVar13) {
      memset(matchtable_ecx1,0,0x100);
      for (lVar14 = 0; lVar14 != 4; lVar14 = lVar14 + 1) {
        uVar13 = raw->basic_cpuid[2][lVar14];
        if (-1 < (int)uVar13) {
          iVar5 = 4;
          while (bVar22 = iVar5 != 0, iVar5 = iVar5 + -1, bVar22) {
            *(undefined1 *)((long)&matchtable_ecx1[0].bit + (ulong)(uVar13 & 0xff)) = 1;
            uVar13 = uVar13 >> 8;
          }
        }
      }
      assign_cache_data(matchtable_ecx1[0].feature._2_1_,L1I,8,4,0x20,data);
      assign_cache_data((uint8_t)matchtable_ecx1[1].bit,L1I,0x10,4,0x20,data);
      assign_cache_data(matchtable_ecx1[1].bit._2_1_,L1D,8,2,0x20,data);
      assign_cache_data((undefined1)matchtable_ecx1[1].feature,L1D,0x10,4,0x20,data);
      assign_cache_data(matchtable_ecx1[4].bit._2_1_,L3,0x200,4,0x40,data);
      assign_cache_data(matchtable_ecx1[4].bit._3_1_,L3,0x400,8,0x40,data);
      assign_cache_data(matchtable_ecx1[4].feature._1_1_,L3,0x800,8,0x40,data);
      assign_cache_data(matchtable_ecx1[5].bit._1_1_,L3,0x1000,8,0x40,data);
      assign_cache_data((undefined1)matchtable_ecx1[5].feature,L1D,0x20,8,0x40,data);
      assign_cache_data((uint8_t)matchtable_ecx1[6].bit,L1I,0x20,8,0x40,data);
      assign_cache_data(matchtable_ecx1[7].bit._1_1_,L2,0x80,4,0x40,data);
      assign_cache_data(matchtable_ecx1[7].bit._2_1_,L2,0xc0,6,0x40,data);
      assign_cache_data(matchtable_ecx1[7].bit._3_1_,L2,0x80,2,0x40,data);
      assign_cache_data((undefined1)matchtable_ecx1[7].feature,L2,0x100,4,0x40,data);
      assign_cache_data(matchtable_ecx1[7].feature._1_1_,L2,0x180,6,0x40,data);
      assign_cache_data(matchtable_ecx1[7].feature._2_1_,L2,0x200,4,0x40,data);
      assign_cache_data(matchtable_ecx1[8].bit._1_1_,L2,0x80,4,0x20,data);
      assign_cache_data(matchtable_ecx1[8].bit._2_1_,L2,0x100,4,0x20,data);
      assign_cache_data(matchtable_ecx1[8].bit._3_1_,L2,0x200,4,0x20,data);
      assign_cache_data((undefined1)matchtable_ecx1[8].feature,L2,0x400,4,0x20,data);
      assign_cache_data(matchtable_ecx1[8].feature._1_1_,L2,0x800,4,0x20,data);
      assign_cache_data(matchtable_ecx1[8].feature._2_1_,L3,0x1000,4,0x40,data);
      assign_cache_data(matchtable_ecx1[8].feature._3_1_,L3,0x2000,8,0x40,data);
      assign_cache_data(matchtable_ecx1[9].bit._2_1_,L3,0x1800,0xc,0x40,data);
      assign_cache_data(matchtable_ecx1[9].bit._3_1_,L3,0x2000,0x10,0x40,data);
      assign_cache_data((undefined1)matchtable_ecx1[9].feature,L3,0x3000,0xc,0x40,data);
      assign_cache_data(matchtable_ecx1[9].feature._1_1_,L3,0x4000,0x10,0x40,data);
      assign_cache_data(matchtable_ecx1[9].feature._2_1_,L2,0x1800,0x18,0x40,data);
      assign_cache_data(local_138,L1D,0x10,8,0x40,data);
      assign_cache_data(local_132,L1D,8,4,0x40,data);
      assign_cache_data(local_131,L1D,0x10,4,0x40,data);
      assign_cache_data(local_130,L1D,0x20,4,0x40,data);
      assign_cache_data(local_128,L1I,0xc,8,-1,data);
      assign_cache_data(local_127,L1I,0x10,8,-1,data);
      assign_cache_data(local_126,L1I,0x20,8,-1,data);
      assign_cache_data(local_125,L1I,0x40,8,-1,data);
      assign_cache_data(local_120,L2,0x400,4,0x40,data);
      assign_cache_data(local_11f,L2,0x80,8,0x40,data);
      assign_cache_data(local_11e,L2,0x100,8,0x40,data);
      assign_cache_data(local_11d,L2,0x200,8,0x40,data);
      assign_cache_data(local_11c,L2,0x400,8,0x40,data);
      assign_cache_data(local_11b,L2,0x800,8,0x40,data);
      assign_cache_data(local_119,L2,0x200,2,0x40,data);
      assign_cache_data(local_116,L2,0x100,8,0x20,data);
      assign_cache_data(local_115,L2,0x200,8,0x20,data);
      assign_cache_data(local_114,L2,0x400,8,0x20,data);
      assign_cache_data(local_113,L2,0x800,8,0x20,data);
      assign_cache_data(local_112,L2,0x200,4,0x40,data);
      assign_cache_data(local_111,L2,0x400,8,0x40,data);
      if (matchtable_ecx1[9].bit._1_1_ != '\0') {
        if (((data->field_11).x86.family == 0xf) && ((data->field_11).x86.model == 6)) {
          data->l3_cache = 0x1000;
          data->l3_assoc = 0x10;
          data->l3_cacheline = 0x40;
        }
        else {
          data->l2_cache = 0x1000;
          data->l2_assoc = 0x10;
          data->l2_cacheline = 0x40;
        }
      }
      if ((char)matchtable_ecx1[8].bit != '\0') {
        if (data->l2_cache == -1) {
          data->l2_cache = 0;
        }
        else {
          data->l3_cache = 0;
        }
      }
    }
  }
  else {
    decode_deterministic_cache_info_x86(raw->intel_fn4,'\b',data,internal);
  }
  if (raw->basic_cpuid[0][0] < 0xb) {
LAB_00110cad:
    decode_number_of_cores_x86(raw,data);
  }
  else {
    uVar13 = 0xffffffff;
    uVar20 = 0xffffffff;
    for (lVar14 = 0;
        ((lVar14 != 0x40 && (*(int *)((long)raw->intel_fn11[0] + lVar14) != 0)) &&
        (uVar17 = *(uint *)((long)raw->intel_fn11[0] + lVar14 + 4), uVar17 != 0));
        lVar14 = lVar14 + 0x10) {
      cVar1 = *(char *)((long)raw->intel_fn11[0] + lVar14 + 9);
      if (cVar1 == '\x02') {
        uVar20 = (ulong)(uVar17 & 0xffff);
      }
      else if (cVar1 == '\x01') {
        uVar13 = uVar17 & 0xffff;
      }
    }
    if ((int)uVar20 == -1 || uVar13 == 0xffffffff) goto LAB_00110cad;
    data->num_logical_cpus = (int)uVar20;
    iVar5 = (int)(uVar20 / uVar13);
    if (iVar5 < 2) {
      iVar5 = 1;
    }
    data->num_cores = iVar5;
  }
  cVar4 = cpuid_identify_purpose_intel(raw);
  data->purpose = cVar4;
  decode_architecture_version_x86(data);
  pcVar21 = data->brand_str;
  sVar7 = strlen(pcVar21);
  uVar20 = 0;
  for (lVar14 = 8; lVar14 != 0xb8; lVar14 = lVar14 + 0x10) {
    iVar5 = match_pattern(pcVar21,*(char **)((long)&DAT_00134cd0 + lVar14));
    if (iVar5 != 0) {
      uVar20 = uVar20 | *(ulong *)(&UNK_00134cc8 + lVar14);
    }
  }
  iVar5 = match_pattern(pcVar21,"Core(TM) [im][3579]");
  if (iVar5 == 0) {
    iVar5 = match_pattern(pcVar21,"Core(TM) [3579]");
    if (iVar5 != 0) {
      uVar8 = uVar20 | 0x10000;
      switch(data->brand_str[(long)iVar5 + 8]) {
      case '3':
        uVar8 = uVar20 | 0x10008;
        break;
      case '5':
        uVar8 = uVar20 | 0x10010;
        break;
      case '7':
        uVar8 = uVar20 | 0x10020;
        break;
      case '9':
        uVar8 = uVar20 | 0x10040;
      }
      uVar20 = uVar8;
      for (uVar9 = (ulong)(iVar5 + 9); uVar9 < sVar7; uVar9 = uVar9 + 1) {
        cVar1 = pcVar21[uVar9];
        switch(cVar1) {
        case 'E':
          uVar20 = uVar20 | 0x2000;
          break;
        case 'F':
          uVar20 = uVar20 | 0x800;
          break;
        case 'G':
        case 'I':
        case 'J':
        case 'K':
          break;
        case 'H':
          uVar20 = uVar20 | 0x80;
          break;
        case 'L':
          uVar20 = uVar20 | 0x400000000;
          break;
        default:
          if (cVar1 == 'T') {
            uVar20 = uVar20 | 0x800000000;
          }
          else if (cVar1 == 'U') {
            uVar20 = uVar20 | 0x200;
          }
        }
      }
      goto switchD_00110f14_caseD_34;
    }
    iVar5 = match_pattern(pcVar21,"Core(TM) Ultra [3579]");
    if (iVar5 == 0) {
      iVar5 = match_pattern(pcVar21,"Xeon(R) w[3579]");
      if (iVar5 == 0) {
        iVar5 = match_pattern(pcVar21,"Xeon(R) [DW]");
        if (iVar5 == 0) {
          iVar5 = match_pattern(pcVar21,"[NU]##");
          if (iVar5 != 0) {
            if (data->vendor_str[(long)iVar5 + 0xf] == 'U') {
              uVar20 = uVar20 | 0x1000000000;
            }
            else if (data->vendor_str[(long)iVar5 + 0xf] == 'N') {
              uVar20 = uVar20 | 0x80000000;
            }
          }
        }
        else if (data->brand_str[(long)iVar5 + 7] == 'W') {
          uVar20 = uVar20 | 0x840000;
        }
        else if (data->brand_str[(long)iVar5 + 7] == 'D') {
          uVar20 = uVar20 | 0x1040000;
        }
        else {
          uVar20 = uVar20 | 0x40000;
        }
      }
      else {
        uVar8 = uVar20 | (ulong)(data->brand_str[(long)iVar5 + 7] == 'w') << 0x17;
        uVar20 = uVar8 | 0x40000;
        switch(data->brand_str[(long)iVar5 + 8]) {
        case '3':
          uVar20 = uVar8 | 0x40008;
          break;
        case '5':
          uVar20 = uVar8 | 0x40010;
          break;
        case '7':
          uVar20 = uVar8 | 0x40020;
          break;
        case '9':
          uVar20 = uVar8 | 0x40040;
        }
      }
      goto switchD_00110f14_caseD_34;
    }
    uVar8 = uVar20 | 0x100010000;
    switch(data->brand_str[(long)iVar5 + 0xe]) {
    case '3':
      uVar8 = 0x100010008;
      break;
    default:
      goto switchD_00110e3a_caseD_34;
    case '5':
      uVar8 = 0x100010010;
      break;
    case '7':
      uVar8 = 0x100010020;
      break;
    case '9':
      uVar8 = 0x100010040;
    }
    uVar8 = uVar20 | uVar8;
switchD_00110e3a_caseD_34:
    uVar20 = uVar8;
    for (uVar9 = (ulong)(iVar5 + 0xf); uVar9 < sVar7; uVar9 = uVar9 + 1) {
      switch(pcVar21[uVar9]) {
      case 'F':
        uVar20 = uVar20 | 0x800;
        break;
      case 'H':
        uVar20 = uVar20 | 0x80;
        break;
      case 'K':
        uVar20 = uVar20 | 0x100000;
        break;
      case 'L':
        uVar20 = uVar20 | 0x400000000;
        break;
      case 'T':
        uVar20 = uVar20 | 0x800000000;
        break;
      case 'U':
        uVar20 = uVar20 | 0x200;
        break;
      case 'V':
        uVar20 = uVar20 | 0x200000000;
        break;
      case 'X':
        uVar20 = uVar20 | 0x400;
      }
    }
  }
  else {
    if (data->brand_str[(long)iVar5 + 8] == 'm') {
      uVar20 = uVar20 | 0x10001;
    }
    else if (data->brand_str[(long)iVar5 + 8] == 'i') {
      uVar20 = uVar20 | 0x30000;
    }
    else {
      uVar20 = uVar20 | 0x10000;
    }
    switch(data->brand_str[(long)iVar5 + 9]) {
    case '3':
      uVar20 = uVar20 | 8;
      break;
    case '5':
      uVar20 = uVar20 | 0x10;
      break;
    case '7':
      uVar20 = uVar20 | 0x20;
      break;
    case '9':
      uVar20 = uVar20 | 0x40;
    }
    for (uVar8 = (ulong)(iVar5 + 10); uVar8 < sVar7; uVar8 = uVar8 + 1) {
      switch(pcVar21[uVar8]) {
      case 'H':
        uVar20 = uVar20 | 0x80;
        break;
      case 'K':
        uVar20 = uVar20 | 0x100000;
        break;
      case 'N':
        uVar20 = uVar20 | 0x400000;
        break;
      case 'P':
        uVar20 = uVar20 | 0x200000;
        break;
      case 'S':
        uVar20 = uVar20 | 0x100;
        break;
      case 'U':
        uVar20 = uVar20 | 0x200;
        break;
      case 'X':
        uVar20 = uVar20 | 0x400;
      }
    }
  }
switchD_00110f14_caseD_34:
  if (((uVar20 & 0xc000) != 0) && (iVar5 = match_pattern(pcVar21,"[JN]"), iVar5 != 0)) {
    if (data->vendor_str[(long)iVar5 + 0xf] == 'N') {
      uVar20 = uVar20 | 0x80000000;
    }
    else if (data->vendor_str[(long)iVar5 + 0xf] == 'J') {
      uVar20 = uVar20 | 0x40000000;
    }
  }
  lVar14 = -0x10;
  do {
    lVar15 = lVar14;
    if (lVar15 + 0x10 == 0xa0) {
      aVar16 = 1;
      goto LAB_0011112c;
    }
    iVar5 = match_pattern(pcVar21,*(char **)((long)&PTR_anon_var_dwarf_a79c_00134c48 + lVar15));
    lVar14 = lVar15 + 0x10;
  } while (iVar5 == 0);
  aVar16 = *(amd_code_t *)(&UNK_00134c40 + lVar15);
LAB_0011112c:
  debugf(2,"intel matchtable result is %d\n",(ulong)aVar16);
  if (((uint)uVar20 >> 0x12 & 1) != 0) {
    iVar5 = match_pattern(pcVar21,"W35##");
    if ((iVar5 == 0) && (iVar5 = match_pattern(pcVar21,"[ELXW]75##"), iVar5 == 0)) {
      iVar5 = match_pattern(pcVar21,"[ELXW]55##");
      if (iVar5 == 0) {
        iVar5 = match_pattern(pcVar21,"[ELXW]56##");
        if (iVar5 == 0) {
          if ((0 < data->l3_cache) && ((data->field_11).x86.family == 0x10)) {
            aVar16 = 0x7d1;
          }
        }
        else {
          aVar16 = 0x7d4;
        }
      }
      else {
        aVar16 = 0x7d3;
      }
    }
    else {
      uVar20 = uVar20 | 0x20;
    }
  }
  iVar5 = match_all(uVar20,0x40004);
  if ((iVar5 == 0) || (brand_code = 0x7d2, data->l3_cache < 1)) {
    if (aVar16 == 0x7d9) {
LAB_00111213:
      brand_code = 0x7d9;
      if (((uVar20 & 2) != 0) && ((data->field_11).x86.model != 0xe)) {
        brand_code = (data->field_11).x86.ext_model < 0x17 ^ 0x7dd;
      }
    }
    else {
      brand_code = aVar16;
      if (aVar16 == 0x7d7) {
        pcVar10 = strstr(pcVar21,"CPU");
        if (pcVar10 != (char *)0x0) {
          for (pcVar10 = pcVar10 + 3; *pcVar10 == ' '; pcVar10 = pcVar10 + 1) {
          }
          if (*pcVar10 == 'T') {
            uVar20 = uVar20 | 2;
          }
        }
        iVar5 = data->num_cores;
        if (iVar5 == 1) {
          brand_code = 0x7d7;
        }
        else if (iVar5 == 4) {
          brand_code = (uint)(4 < data->num_logical_cpus) * 2 + 0x7de;
        }
        else if (iVar5 == 2) {
          brand_code = 0x7df;
          if (data->num_logical_cpus < 3) goto LAB_00111213;
        }
        else {
          brand_code = 0x7e1;
        }
      }
    }
  }
  if (((data->field_11).x86.ext_model == 0x17) &&
     (((brand_code == 0x7d9 || (brand_code == 0x7e2)) || ((short)uVar20 < 0)))) {
    brand_code = 0x7db;
  }
  sVar7 = strlen(pcVar21);
  iVar5 = match_pattern(pcVar21,"Core(TM) i[3579]");
  iVar6 = (int)sVar7;
  if (iVar5 != 0) {
    local_1ac = 0xffffffff;
    uVar13 = 0xffffffff;
    if (iVar5 + 0xe < iVar6) {
      bVar12 = data->brand_str[(long)iVar5 + 0xb];
      if ((byte)(bVar12 - 0x32) < 8) {
        uVar13 = bVar12 + 0x3c;
      }
      else {
        uVar13 = local_1ac;
        if (((iVar5 + 0xf < iVar6) && (bVar12 == 0x31)) &&
           ((byte)(data->brand_str[(long)iVar5 + 0xc] - 0x30U) < 5)) {
          uVar13 = (byte)data->brand_str[(long)iVar5 + 0xc] + 0x46;
        }
      }
    }
    goto switchD_001117ed_caseD_1e;
  }
  iVar5 = match_pattern(pcVar21,"Core(TM) [3579]");
  if (iVar5 != 0) {
    if (iVar5 + 0xd < iVar6) {
      cVar1 = data->brand_str[(long)iVar5 + 0xb];
      if ((((cVar1 == '3') || (cVar1 == '2')) || (cVar1 == '1')) &&
         (local_1ac = 0x82, uVar13 = local_1ac, data->brand_str[(long)iVar5 + 0xc] == '5'))
      goto switchD_001117ed_caseD_1e;
    }
    local_1ac = 0xffffffff;
    uVar13 = local_1ac;
    goto switchD_001117ed_caseD_1e;
  }
  iVar5 = match_pattern(pcVar21,"Core(TM) Ultra [3579]");
  if (iVar5 == 0) {
    iVar5 = match_pattern(pcVar21,"Xeon(R) [WBSGP]");
    if (iVar5 == 0) {
      iVar5 = 3;
      if (3 < iVar6) {
        iVar5 = iVar6;
      }
      pcVar21 = data->brand_str + 4;
      for (lVar14 = -3; uVar13 = 0xffffffff, (ulong)(iVar5 - 3) + lVar14 != -3; lVar14 = lVar14 + -1
          ) {
        if (((pcVar21[-4] == 'C') && (pcVar21[-3] == 'P')) && (pcVar21[-2] == 'U')) {
          lVar14 = -lVar14;
          goto LAB_001114dd;
        }
        pcVar21 = pcVar21 + 1;
      }
      goto switchD_001117ed_caseD_1e;
    }
    iVar5 = match_pattern(pcVar21,"Xeon(R) W-");
    if (iVar5 == 0) {
      iVar5 = match_pattern(pcVar21,"Xeon(R) Bronze");
      if ((iVar5 == 0) && (iVar5 = match_pattern(pcVar21,"Xeon(R) Silver"), iVar5 == 0)) {
        iVar5 = match_pattern(pcVar21,"Xeon(R) Gold");
        if (iVar5 == 0) {
          iVar5 = match_pattern(pcVar21,"Xeon(R) Platinum");
          if (iVar5 == 0) {
            iVar5 = match_pattern(pcVar21,"Xeon(R) Max");
            if (iVar5 == 0) goto switchD_001117b7_default;
            iVar5 = iVar5 + 0xc;
          }
          else {
            iVar5 = iVar5 + 0x11;
          }
        }
        else {
          iVar5 = iVar5 + 0xd;
        }
      }
      else {
        iVar5 = iVar5 + 0xf;
      }
    }
    else {
      iVar5 = iVar5 + 10;
    }
    local_1ac = 0xffffffff;
    uVar13 = local_1ac;
    if ((iVar5 != 0) && ((byte)(pcVar21[iVar5] - 0x31U) < 5)) {
      uVar13 = (byte)pcVar21[iVar5] + 0x4a;
    }
  }
  else {
    if (iVar5 + 0x12 < iVar6) {
      uVar13 = 0x80;
      if (data->brand_str[(long)iVar5 + 0x10] != '1') {
        uVar13 = -(uint)(data->brand_str[(long)iVar5 + 0x10] != '2') | 0x81;
      }
      goto switchD_001117ed_caseD_1e;
    }
switchD_001117b7_default:
    uVar13 = 0xffffffff;
  }
switchD_001117ed_caseD_1e:
  local_1ac = uVar13;
  lVar14 = 0;
  do {
    lVar15 = lVar14;
    if (lVar15 + 0x10 == 0x180) goto LAB_001115d1;
    lVar14 = lVar15 + 0x10;
  } while (brand_code != *(amd_code_t *)((long)&intel_bcode_str[0].code + lVar15));
  if (*(long *)((long)&intel_bcode_str[0].str + lVar15) == 0) {
LAB_001115d1:
    debugf(2,"Detected Intel brand code: %d\n",(ulong)brand_code);
  }
  else {
    debugf(2,"Detected Intel brand code: %d (%s)\n",(ulong)brand_code);
  }
  if (uVar20 != 0) {
    debugf(2,"Detected Intel bits: ");
    debug_print_lbits(2,uVar20);
  }
  debugf(2,"Detected Intel model code: %d\n",(ulong)local_1ac);
  (internal->code).amd = brand_code;
  internal->bits = uVar20;
  if (((data->flags[0x6b] != '\0') &&
      (debugf(2,"SGX seems to be present, decoding...\n"), 0x11 < raw->basic_cpuid[0][0])) &&
     (uVar13 = raw->basic_cpuid[0x12][0], uVar13 != 0)) {
    if ((uVar13 & 1) != 0) {
      *(undefined1 *)((long)&data->field_11 + 0x1e) = 1;
      uVar13 = raw->basic_cpuid[0x12][0];
    }
    if ((uVar13 & 2) != 0) {
      *(undefined1 *)((long)&data->field_11 + 0x1f) = 1;
    }
    if ((*(char *)((long)&data->field_11 + 0x1e) != '\0') ||
       (*(char *)((long)&data->field_11 + 0x1f) != '\0')) {
      (data->field_11).x86.sgx.present = 1;
    }
    (data->field_11).x86.sgx.misc_select = raw->basic_cpuid[0x12][1];
    uVar2 = *(undefined1 *)((long)raw->basic_cpuid[0x12] + 0xd);
    *(char *)((long)&data->field_11 + 0x1c) = (char)raw->basic_cpuid[0x12][3];
    *(undefined1 *)((long)&data->field_11 + 0x1d) = uVar2;
    *(undefined8 *)((long)&data->field_11 + 0x38) = *(undefined8 *)raw->intel_fn12h[1];
    *(undefined8 *)((long)&data->field_11 + 0x40) = *(undefined8 *)(raw->intel_fn12h[1] + 2);
    (data->field_11).x86.sgx.num_epc_sections = -1;
    for (uVar13 = 0; uVar13 != 1000000; uVar13 = uVar13 + 1) {
      cVar23 = cpuid_get_epc(uVar13,raw);
      if (cVar23.length == 0) {
        debugf(2,"SGX: epc section request for %d returned null, no more EPC sections.\n",
               (ulong)uVar13);
        goto LAB_00111733;
      }
    }
    if ((data->field_11).x86.sgx.num_epc_sections == -1) {
      debugf(1,"SGX: warning: seems to be infinitude of EPC sections.\n");
LAB_00111733:
      (data->field_11).x86.sgx.num_epc_sections = uVar13;
    }
  }
  iVar5 = match_cpu_codename(cpudb_intel,0x1a2,data,brand_code,uVar20,local_1ac);
  internal->score = iVar5;
  return 0;
LAB_001114dd:
  if (iVar6 + -4 <= lVar14) goto switchD_001117ed_caseD_1e;
  if (pcVar21[-1] != ' ') {
    ppuVar11 = __ctype_b_loc();
    uVar17 = 0;
    goto LAB_00111504;
  }
  lVar14 = lVar14 + 1;
  pcVar21 = pcVar21 + 1;
  goto LAB_001114dd;
LAB_00111504:
  if (lVar14 < iVar6 + -4) {
    lVar15 = (long)pcVar21[-1];
    uVar3 = (*ppuVar11)[lVar15];
    if ((uVar3 >> 0xb & 1) == 0) goto code_r0x0011151a;
    iVar6 = 0;
    iVar5 = 4;
    while ((uVar3 >> 0xb & 1) != 0) {
      iVar6 = iVar6 * 10 + (int)(char)lVar15 + -0x30;
      lVar15 = (long)*pcVar21;
      pcVar21 = pcVar21 + 1;
      iVar5 = iVar5 + -1;
      uVar3 = (*ppuVar11)[lVar15];
    }
    if (iVar5 != 0) goto switchD_001117b7_default;
    local_1ac = 100;
    uVar13 = local_1ac;
    switch(iVar6 / 100) {
    case 0x1e:
      break;
    case 0x1f:
      uVar13 = 0x65;
      break;
    case 0x20:
      uVar13 = ((uVar17 >> 0x17 & 1) != 0) + 0x66;
      break;
    case 0x21:
      uVar13 = ((uVar17 >> 0x17 & 1) != 0) + 0x68;
      break;
    default:
      switch(iVar6 / 100) {
      case 0x33:
        uVar13 = 0x6a;
        break;
      case 0x34:
        uVar13 = 0x6b;
        break;
      case 0x35:
        uVar13 = 0x6c;
        break;
      case 0x36:
        uVar13 = 0x6d;
        break;
      default:
        goto switchD_001117b7_default;
      }
    }
    goto switchD_001117ed_caseD_1e;
  }
  goto switchD_001117b7_default;
code_r0x0011151a:
  bVar12 = pcVar21[-1] + 0xbf;
  uVar13 = 1 << (bVar12 & 0x1f);
  if (0x19 < bVar12) {
    uVar13 = 0;
  }
  uVar17 = uVar17 | uVar13;
  lVar14 = lVar14 + 1;
  pcVar21 = pcVar21 + 1;
  goto LAB_00111504;
}

Assistant:

int cpuid_identify_intel(struct cpu_raw_data_t* raw, struct cpu_id_t* data, struct internal_id_info_t* internal)
{
	intel_code_and_bits_t brand;
	intel_model_t model_code;
	int i;
	char* brand_code_str = NULL;

	load_intel_features(raw, data);
	if (raw->basic_cpuid[0][EAX] >= 4) {
		/* Deterministic way is preferred, being more generic */
		decode_deterministic_cache_info_x86(raw->intel_fn4, MAX_INTELFN4_LEVEL, data, internal);
	} else if (raw->basic_cpuid[0][EAX] >= 2) {
		decode_intel_oldstyle_cache_info(raw, data);
	}
	if ((raw->basic_cpuid[0][EAX] < 11) || (decode_intel_extended_topology(raw, data) == 0))
		decode_number_of_cores_x86(raw, data);
	data->purpose = cpuid_identify_purpose_intel(raw);
	decode_architecture_version_x86(data);

	brand = get_brand_code_and_bits(data);
	model_code = get_model_code(data);
	for (i = 0; i < COUNT_OF(intel_bcode_str); i++) {
		if (brand.code == intel_bcode_str[i].code) {
			brand_code_str = intel_bcode_str[i].str;
			break;
		}
	}
	if (brand_code_str)
		debugf(2, "Detected Intel brand code: %d (%s)\n", brand.code, brand_code_str);
	else
		debugf(2, "Detected Intel brand code: %d\n", brand.code);
	if (brand.bits) {
		debugf(2, "Detected Intel bits: ");
		debug_print_lbits(2, brand.bits);
	}
	debugf(2, "Detected Intel model code: %d\n", model_code);

	internal->code.intel = brand.code;
	internal->bits = brand.bits;

	if (data->flags[CPU_FEATURE_SGX]) {
		debugf(2, "SGX seems to be present, decoding...\n");
		// if SGX is indicated by the CPU, verify its presence:
		decode_intel_sgx_features(raw, data);
	}

	internal->score = match_cpu_codename(cpudb_intel, COUNT_OF(cpudb_intel), data,
		brand.code, brand.bits, model_code);
	return 0;
}